

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_parse(int argc,char **argv,void **argtable)

{
  arg_end *endtable;
  code *pcVar1;
  int iVar2;
  long lVar3;
  char **nargv;
  size_t sVar4;
  char *pcVar5;
  int *__ptr;
  byte *pbVar6;
  size_t sVar7;
  char *pcVar8;
  byte *pbVar9;
  void **ppvVar10;
  char *pcVar11;
  int *piVar12;
  int iVar13;
  byte bVar14;
  char cVar15;
  long lVar16;
  void *pvVar17;
  void *pvVar18;
  arg_hdr **table;
  arg_hdr *hdr;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    if (*(code **)(pbVar9 + 0x38) != (code *)0x0) {
      (**(code **)(pbVar9 + 0x38))(*(undefined8 *)(pbVar9 + 0x30));
      pbVar9 = (byte *)*ppvVar10;
    }
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  lVar3 = -0x100000000;
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    lVar3 = lVar3 + 0x100000000;
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar3 >> 0x1d));
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
    goto LAB_00107631;
  }
  nargv = (char **)malloc((long)argc * 8 + 8);
  if (nargv == (char **)0x0) {
    iVar13 = (endtable->hdr).maxcount;
    if (endtable->count < iVar13) {
      endtable->error[endtable->count] = 2;
      iVar13 = endtable->count;
      endtable->parent[iVar13] = endtable;
      endtable->argval[iVar13] = (char *)0x0;
      endtable->count = iVar13 + 1;
    }
    else {
      endtable->error[(long)iVar13 + -1] = 1;
      lVar3 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar3 + -1] = endtable;
      endtable->argval[lVar3 + -1] = (char *)0x0;
    }
    goto LAB_00107631;
  }
  if (0 < argc) {
    memcpy(nargv,argv,(ulong)(uint)argc << 3);
  }
  nargv[argc] = (char *)0x0;
  iVar13 = 1;
  lVar3 = 0;
  lVar16 = 0;
  do {
    pbVar9 = (byte *)argtable[lVar3];
    pcVar5 = *(char **)(pbVar9 + 0x10);
    if (pcVar5 != (char *)0x0) {
      sVar4 = strlen(pcVar5);
      do {
        iVar13 = iVar13 + 1;
        pcVar5 = strchr(pcVar5 + 1,0x2c);
      } while (pcVar5 != (char *)0x0);
      lVar16 = lVar16 + sVar4;
    }
    lVar16 = lVar16 + 1;
    lVar3 = lVar3 + 1;
  } while ((*pbVar9 & 1) == 0);
  __ptr = (int *)malloc((long)iVar13 * 0x20 + lVar16 + 0x10);
  if (__ptr != (int *)0x0) {
    *__ptr = 0;
    __ptr[1] = iVar13;
    piVar12 = __ptr + 4;
    *(int **)(__ptr + 2) = piVar12;
    pbVar9 = (byte *)*argtable;
    if ((*pbVar9 & 1) == 0) {
      piVar19 = piVar12 + (long)iVar13 * 8;
      lVar3 = 0;
      lVar16 = 0;
      do {
        pcVar5 = *(char **)(pbVar9 + 0x10);
        if ((pcVar5 != (char *)0x0) && (cVar15 = *pcVar5, cVar15 != '\0')) {
          lVar16 = (long)(int)lVar16;
          piVar20 = piVar19;
          piVar21 = piVar19;
          do {
            while ((piVar19 = (int *)((long)piVar20 + 1), cVar15 != '\0' && (cVar15 != ','))) {
              *(char *)piVar20 = cVar15;
              pcVar8 = pcVar5 + 1;
              pcVar5 = pcVar5 + 1;
              piVar20 = piVar19;
              cVar15 = *pcVar8;
            }
            *(undefined1 *)piVar20 = 0;
            cVar15 = *pcVar5;
            piVar12 = *(int **)(__ptr + 2);
            *(int **)(piVar12 + lVar16 * 8) = piVar21;
            *(int **)(piVar12 + lVar16 * 8 + 4) = __ptr;
            piVar12[lVar16 * 8 + 6] = (int)lVar3;
            if ((*argtable[lVar3] & 4) == 0) {
              if ((*argtable[lVar3] & 2) == 0) {
                piVar12[lVar16 * 8 + 2] = 0;
              }
              else {
                piVar12[lVar16 * 8 + 2] = 1;
              }
            }
            else {
              piVar12[lVar16 * 8 + 2] = 2;
            }
            pcVar5 = pcVar5 + (cVar15 == ',');
            lVar16 = lVar16 + 1;
            cVar15 = *pcVar5;
            piVar20 = piVar19;
            piVar21 = piVar19;
          } while (cVar15 != '\0');
        }
        pbVar9 = (byte *)argtable[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while ((*pbVar9 & 1) == 0);
      lVar3 = (long)(int)lVar16;
    }
    else {
      lVar3 = 0;
    }
    (piVar12 + lVar3 * 8)[0] = 0;
    (piVar12 + lVar3 * 8)[1] = 0;
    piVar12[lVar3 * 8 + 2] = 0;
    (piVar12 + lVar3 * 8 + 4)[0] = 0;
    (piVar12 + lVar3 * 8 + 4)[1] = 0;
    piVar12[lVar3 * 8 + 6] = 0;
  }
  pbVar9 = (byte *)*argtable;
  if ((*pbVar9 & 1) == 0) {
    sVar4 = 2;
    pbVar6 = pbVar9;
    ppvVar10 = argtable;
    do {
      ppvVar10 = ppvVar10 + 1;
      if (*(char **)(pbVar6 + 8) == (char *)0x0) {
        lVar3 = 0;
      }
      else {
        sVar7 = strlen(*(char **)(pbVar6 + 8));
        lVar3 = sVar7 * 3;
      }
      sVar4 = sVar4 + lVar3;
      pbVar6 = (byte *)*ppvVar10;
    } while ((*pbVar6 & 1) == 0);
    pcVar5 = (char *)malloc(sVar4);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar8 = pcVar5 + 1;
      *pcVar5 = ':';
      lVar3 = 0;
      do {
        pcVar11 = *(char **)(pbVar9 + 8);
        if (pcVar11 != (char *)0x0) {
          cVar15 = *pcVar11;
          while (cVar15 != '\0') {
            pcVar11 = pcVar11 + 1;
            *pcVar8 = cVar15;
            bVar14 = *pbVar9;
            if ((bVar14 & 2) == 0) {
              pcVar8 = pcVar8 + 1;
            }
            else {
              pcVar8[1] = ':';
              pcVar8 = pcVar8 + 2;
              bVar14 = *pbVar9;
            }
            if ((bVar14 & 4) != 0) {
              *pcVar8 = ':';
              pcVar8 = pcVar8 + 1;
            }
            cVar15 = *pcVar11;
          }
        }
        pbVar9 = (byte *)argtable[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while ((*pbVar9 & 1) == 0);
LAB_0010708b:
      *pcVar8 = '\0';
      if (__ptr != (int *)0x0) {
        optind = 0;
        opterr = 0;
LAB_001070ae:
        iVar13 = getopt_internal(argc,nargv,pcVar5,*(option **)(__ptr + 2),(int *)0x0,1);
        if (0x39 < iVar13) {
          if (iVar13 != 0x3a) {
            if (iVar13 != 0x3f) goto LAB_001071e7;
            iVar13 = endtable->count;
            iVar2 = (endtable->hdr).maxcount;
            piVar12 = endtable->error;
            if (optopt == 0) {
              if (iVar13 < iVar2) {
                pcVar8 = nargv[(long)optind + -1];
                piVar12[iVar13] = 4;
                goto LAB_001072cc;
              }
            }
            else if (iVar13 < iVar2) {
              piVar12[iVar13] = optopt;
              lVar3 = (long)endtable->count;
              endtable->parent[lVar3] = endtable;
              endtable->argval[lVar3] = (char *)0x0;
              goto LAB_001073ca;
            }
            piVar12[(long)iVar2 + -1] = 1;
            goto LAB_001073dd;
          }
          iVar13 = (endtable->hdr).maxcount;
          if (iVar13 <= endtable->count) {
            endtable->error[(long)iVar13 + -1] = 1;
            goto LAB_001073dd;
          }
          pcVar8 = nargv[(long)optind + -1];
          endtable->error[endtable->count] = 5;
LAB_001072cc:
          lVar3 = (long)endtable->count;
          endtable->parent[lVar3] = endtable;
          endtable->argval[lVar3] = pcVar8;
          goto LAB_001073ca;
        }
        if (iVar13 == 0) goto code_r0x00107134;
        if (iVar13 != -1) {
LAB_001071e7:
          pbVar9 = (byte *)*argtable;
          if ((*pbVar9 & 1) == 0) {
            lVar3 = 0;
            ppvVar10 = argtable + 1;
            do {
              if ((*(char **)(pbVar9 + 8) != (char *)0x0) &&
                 (pcVar8 = strchr(*(char **)(pbVar9 + 8),(int)(char)iVar13), pcVar8 != (char *)0x0))
              {
                lVar3 = *(long *)((long)argtable + (lVar3 >> 0x1d));
                pcVar1 = *(code **)(lVar3 + 0x40);
                if (pcVar1 == (code *)0x0) goto LAB_001070ae;
                pvVar17 = *(void **)(lVar3 + 0x30);
                iVar13 = (*pcVar1)(pvVar17,optarg);
                pcVar8 = optarg;
                if (iVar13 == 0) goto LAB_001070ae;
                iVar2 = (endtable->hdr).maxcount;
                piVar12 = endtable->error;
                if (iVar2 <= endtable->count) goto LAB_001073d5;
                piVar12[endtable->count] = iVar13;
                lVar3 = (long)endtable->count;
                endtable->parent[lVar3] = pvVar17;
                goto LAB_001073c2;
              }
              pbVar9 = (byte *)*ppvVar10;
              lVar3 = lVar3 + 0x100000000;
              ppvVar10 = ppvVar10 + 1;
            } while ((*pbVar9 & 1) == 0);
          }
          iVar2 = (endtable->hdr).maxcount;
          if (endtable->count < iVar2) {
            endtable->error[endtable->count] = iVar13;
            iVar13 = endtable->count;
            endtable->parent[iVar13] = endtable;
            endtable->argval[iVar13] = (char *)0x0;
            endtable->count = iVar13 + 1;
          }
          else {
            endtable->error[(long)iVar2 + -1] = 1;
            lVar3 = (long)(endtable->hdr).maxcount;
            endtable->parent[lVar3 + -1] = endtable;
            endtable->argval[lVar3 + -1] = (char *)0x0;
          }
          goto LAB_001070ae;
        }
        goto LAB_0010748e;
      }
    }
  }
  else {
    pcVar5 = (char *)malloc(2);
    if (pcVar5 != (char *)0x0) {
      pcVar8 = pcVar5 + 1;
      *pcVar5 = ':';
      goto LAB_0010708b;
    }
    pcVar5 = (char *)0x0;
  }
  iVar13 = (endtable->hdr).maxcount;
  if (endtable->count < iVar13) {
    endtable->error[endtable->count] = 2;
    iVar13 = endtable->count;
    endtable->parent[iVar13] = endtable;
    endtable->argval[iVar13] = (char *)0x0;
    endtable->count = iVar13 + 1;
  }
  else {
    endtable->error[(long)iVar13 + -1] = 1;
    lVar3 = (long)(endtable->hdr).maxcount;
    endtable->parent[lVar3 + -1] = endtable;
    endtable->argval[lVar3 + -1] = (char *)0x0;
  }
LAB_0010748e:
  free(pcVar5);
  free(__ptr);
  pbVar9 = (byte *)*argtable;
  iVar13 = optind;
  if ((*pbVar9 & 1) == 0) {
    lVar3 = 0;
    iVar2 = 0;
    pcVar5 = (char *)0x0;
    pvVar17 = (void *)0x0;
    do {
      while( true ) {
        if (argc <= iVar13) goto LAB_00107616;
        pvVar18 = pvVar17;
        if (((*(long *)(pbVar9 + 0x10) == 0) && (*(long *)(pbVar9 + 8) == 0)) &&
           (*(code **)(pbVar9 + 0x40) != (code *)0x0)) break;
LAB_0010752b:
        pbVar9 = (byte *)argtable[lVar3 + 1];
        lVar3 = lVar3 + 1;
        pvVar17 = pvVar18;
        if ((*pbVar9 & 1) != 0) {
          if (iVar2 != 0) {
            iVar13 = (endtable->hdr).maxcount;
            if (endtable->count < iVar13) {
              endtable->error[endtable->count] = iVar2;
              iVar13 = endtable->count;
              endtable->parent[iVar13] = pvVar18;
              endtable->argval[iVar13] = pcVar5;
              endtable->count = iVar13 + 1;
            }
            else {
              endtable->error[(long)iVar13 + -1] = 1;
              lVar3 = (long)(endtable->hdr).maxcount;
              endtable->parent[lVar3 + -1] = endtable;
              endtable->argval[lVar3 + -1] = (char *)0x0;
            }
            iVar13 = optind + 1;
            optind = optind + 1;
          }
          goto LAB_00107611;
        }
      }
      pvVar18 = *(void **)(pbVar9 + 0x30);
      iVar2 = (**(code **)(pbVar9 + 0x40))(pvVar18,nargv[iVar13]);
      if (iVar2 != 0) {
        pcVar5 = nargv[optind];
        iVar13 = optind;
        goto LAB_0010752b;
      }
      iVar13 = optind + 1;
      pbVar9 = (byte *)argtable[lVar3];
      iVar2 = 0;
      optind = iVar13;
    } while ((*pbVar9 & 1) == 0);
  }
LAB_00107611:
  while (iVar13 < argc) {
    optind = iVar13 + 1;
    iVar2 = (endtable->hdr).maxcount;
    if (endtable->count < iVar2) {
      pcVar5 = nargv[iVar13];
      endtable->error[endtable->count] = 3;
      iVar13 = endtable->count;
      endtable->parent[iVar13] = endtable;
      endtable->argval[iVar13] = pcVar5;
      endtable->count = iVar13 + 1;
      iVar13 = optind;
    }
    else {
      endtable->error[(long)iVar2 + -1] = 1;
      lVar3 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar3 + -1] = endtable;
      endtable->argval[lVar3 + -1] = (char *)0x0;
      iVar13 = optind;
    }
  }
LAB_00107616:
  if (endtable->count == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
  }
  free(nargv);
LAB_00107631:
  return endtable->count;
code_r0x00107134:
  iVar13 = *__ptr;
  pvVar17 = *(void **)((long)argtable[iVar13] + 0x30);
  if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*argtable[iVar13] & 2) != 0)) {
    iVar2 = (endtable->hdr).maxcount;
    if (endtable->count < iVar2) {
      pcVar8 = nargv[(long)optind + -1];
      endtable->error[endtable->count] = 5;
      iVar2 = endtable->count;
      endtable->parent[iVar2] = endtable;
      endtable->argval[iVar2] = pcVar8;
      endtable->count = iVar2 + 1;
    }
    else {
      endtable->error[(long)iVar2 + -1] = 1;
      lVar3 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar3 + -1] = endtable;
      endtable->argval[lVar3 + -1] = (char *)0x0;
    }
  }
  if ((*(code **)((long)argtable[iVar13] + 0x40) != (code *)0x0) &&
     (iVar13 = (**(code **)((long)argtable[iVar13] + 0x40))(pvVar17,optarg), pcVar8 = optarg,
     iVar13 != 0)) {
    iVar2 = (endtable->hdr).maxcount;
    piVar12 = endtable->error;
    if (endtable->count < iVar2) {
      piVar12[endtable->count] = iVar13;
      lVar3 = (long)endtable->count;
      endtable->parent[lVar3] = pvVar17;
LAB_001073c2:
      endtable->argval[lVar3] = pcVar8;
LAB_001073ca:
      endtable->count = (int)lVar3 + 1;
    }
    else {
LAB_001073d5:
      piVar12[(long)iVar2 + -1] = 1;
LAB_001073dd:
      lVar3 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar3 + -1] = endtable;
      endtable->argval[lVar3 + -1] = (char *)0x0;
    }
  }
  goto LAB_001070ae;
}

Assistant:

int arg_parse(int argc, char * *argv, void * *argtable) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	struct arg_end * endtable;
	int endindex;
	char * *argvcopy = NULL;

	/*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

	/* reset any argtable data from previous invocations */
	arg_reset(argtable);

	/* locate the first end-of-table marker within the array */
	endindex = arg_endindex(table);
	endtable = (struct arg_end *)table[endindex];

	/* Special case of argc==0.  This can occur on Texas Instruments DSP. */
	/* Failure to trap this case results in an unwanted NULL result from  */
	/* the malloc for argvcopy (next code block).                         */
	if (argc == 0) {
		/* We must still perform post-parse checks despite the absence of command line arguments */
		arg_parse_check(table, endtable);

		/* Now we are finished */
		return endtable->count;
	}

	argvcopy = (char **)malloc(sizeof(char *) * (argc + 1));

	if (argvcopy) {
		int i;

		/*
		   Fill in the local copy of argv[]. We need a local copy
		   because getopt rearranges argv[] which adversely affects
		   susbsequent parsing attempts.
		 */
		for (i = 0; i < argc; i++) {
			argvcopy[i] = argv[i];
		}

		argvcopy[argc] = NULL;

		/* parse the command line (local copy) for tagged options */
		arg_parse_tagged(argc, argvcopy, table, endtable);

		/* parse the command line (local copy) for untagged options */
		arg_parse_untagged(argc, argvcopy, table, endtable);

		/* if no errors so far then perform post-parse checks otherwise dont bother */
		if (endtable->count == 0) {
			arg_parse_check(table, endtable);
		}

		/* release the local copt of argv[] */
		free(argvcopy);
	} else {
		/* memory alloc failed */
		arg_register_error(endtable, endtable, ARG_EMALLOC, NULL);
	}

	return endtable->count;
}